

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  col_type *pcVar1;
  double dVar2;
  PFNGLUNIFORM1IPROC p_Var3;
  PFNGLUNIFORMMATRIX4FVPROC p_Var4;
  int iVar5;
  GLint GVar6;
  GLFWwindow *window;
  long *plVar7;
  size_t sVar8;
  stbi_uc *psVar9;
  ulong uVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  float fVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  float fVar30;
  float fVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  bool show_another_window;
  float local_928;
  int height;
  int width;
  uint VAO;
  undefined8 local_918;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  undefined8 uStack_900;
  undefined8 local_8f8;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  uint texture2;
  uint texture1;
  uint VBO;
  float a;
  undefined4 uStack_8c4;
  undefined4 uStack_8c0;
  undefined4 uStack_8bc;
  undefined1 local_8b8 [16];
  float local_8a4;
  float local_8a0;
  int nrChannels;
  undefined1 local_898 [16];
  mat4 projection;
  mat4 view;
  long *local_7e0 [2];
  long local_7d0 [2];
  int nrAttributes;
  string local_7b8;
  string local_798;
  Shader shader;
  char path [1024];
  float vertices [180];
  
  show_another_window = true;
  glfwSetErrorCallback(error_callback);
  iVar5 = glfwInit();
  if (iVar5 == 0) {
    iVar5 = 1;
  }
  else {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    window = (GLFWwindow *)glfwCreateWindow(800,600,"ImGui GLFW example 09",0,0);
    glfwMakeContextCurrent(window);
    glfwSetFramebufferSizeCallback(window,framebuffer_size_callback);
    glfwSetCursorPosCallback(window,mouse_callback);
    glfwSetScrollCallback(window,scroll_callback);
    glfwSetInputMode(window,0x33001,0x34003);
    gl3wInit();
    (*gl3wEnable)(0xb71);
    (*gl3wGetIntegerv)(0x8869,&nrAttributes);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Maximum nr of vertex attributes supported: ",0x2b);
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,nrAttributes);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    ImGui_ImplGlfwGL3_Init(window,true);
    getcwd(path,0x3ff);
    shader.mFSsource._M_dataplus._M_p = (pointer)&shader.mFSsource.field_2;
    shader.mFSsource._M_string_length = 0;
    shader.mFSsource.field_2._M_local_buf[0] = '\0';
    shader.mVSsource._M_dataplus._M_p = (pointer)&shader.mVSsource.field_2;
    shader.mVSsource._M_string_length = 0;
    shader.mVSsource.field_2._M_local_buf[0] = '\0';
    shader.mGSsource._M_dataplus._M_p = (pointer)&shader.mGSsource.field_2;
    shader.mGSsource._M_string_length = 0;
    shader.mGSsource.field_2._M_local_buf[0] = '\0';
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    sVar8 = strlen(path);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,path,path + sVar8);
    Shader::loadVS(&shader,&local_798);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
    }
    local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
    sVar8 = strlen(path);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,path,path + sVar8);
    Shader::loadFS(&shader,&local_7b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
      operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
    }
    Shader::build(&shader);
    memcpy(vertices,&DAT_00160540,0x2d0);
    (*gl3wGenVertexArrays)(1,&VAO);
    (*gl3wGenBuffers)(1,&VBO);
    (*gl3wBindVertexArray)(VAO);
    (*gl3wBindBuffer)(0x8892,VBO);
    (*gl3wBufferData)(0x8892,0x2d0,vertices,0x88e4);
    (*gl3wVertexAttribPointer)(0,3,0x1406,'\0',0x14,(GLvoid *)0x0);
    (*gl3wEnableVertexAttribArray)(0);
    (*gl3wVertexAttribPointer)(1,2,0x1406,'\0',0x14,(GLvoid *)0xc);
    (*gl3wEnableVertexAttribArray)(1);
    (*gl3wGenTextures)(1,&texture1);
    (*gl3wBindTexture)(0xde1,texture1);
    (*gl3wTexParameteri)(0xde1,0x2802,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2803,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2801,0x2601);
    (*gl3wTexParameteri)(0xde1,0x2800,0x2601);
    stbi__vertically_flip_on_load = 1;
    getcwd(path,0x3ff);
    sVar8 = strlen(path);
    builtin_strncpy(path + sVar8,"/container.jpg",0xf);
    printf("path[%s]\n",path);
    psVar9 = stbi_load(path,&width,&height,&nrChannels,0);
    if (psVar9 == (stbi_uc *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to load texture",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    else {
      (*gl3wTexImage2D)(0xde1,0,0x1907,width,height,0,0x1907,0x1401,psVar9);
      (*gl3wGenerateMipmap)(0xde1);
    }
    free(psVar9);
    (*gl3wGenTextures)(1,&texture2);
    (*gl3wBindTexture)(0xde1,texture2);
    (*gl3wTexParameteri)(0xde1,0x2802,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2803,0x2901);
    (*gl3wTexParameteri)(0xde1,0x2801,0x2601);
    (*gl3wTexParameteri)(0xde1,0x2800,0x2601);
    getcwd(path,0x3ff);
    sVar8 = strlen(path);
    builtin_strncpy(path + sVar8,"/awesomeface.png",0x11);
    printf("path[%s]\n",path);
    psVar9 = stbi_load(path,&width,&height,&nrChannels,0);
    if (psVar9 == (stbi_uc *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to load texture",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    else {
      (*gl3wTexImage2D)(0xde1,0,0x1907,width,height,0,0x1908,0x1401,psVar9);
      (*gl3wGenerateMipmap)(0xde1);
    }
    free(psVar9);
    (*gl3wUseProgram)(shader.pID);
    pcVar1 = projection.value + 1;
    projection.value[0].field_0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&projection,"texture1","");
    p_Var3 = gl3wUniform1i;
    GVar6 = (*gl3wGetUniformLocation)(shader.pID,(GLchar *)projection.value[0].field_0._0_8_);
    (*p_Var3)(GVar6,0);
    if ((col_type *)projection.value[0].field_0._0_8_ != pcVar1) {
      operator_delete((void *)projection.value[0].field_0._0_8_,
                      projection.value[1].field_0._0_8_ + 1);
    }
    projection.value[0].field_0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&projection,"texture2","");
    p_Var3 = gl3wUniform1i;
    GVar6 = (*gl3wGetUniformLocation)(shader.pID,(GLchar *)projection.value[0].field_0._0_8_);
    (*p_Var3)(GVar6,1);
    if ((col_type *)projection.value[0].field_0._0_8_ != pcVar1) {
      operator_delete((void *)projection.value[0].field_0._0_8_,
                      projection.value[1].field_0._0_8_ + 1);
    }
    while( true ) {
      iVar5 = glfwWindowShouldClose(window);
      if (iVar5 != 0) break;
      dVar2 = (double)glfwGetTime();
      deltaTime = (float)dVar2 - lastFrame;
      lastFrame = (float)dVar2;
      processInput(window);
      ImGui_ImplGlfwGL3_NewFrame();
      if (show_another_window == true) {
        projection.value[0].field_0._0_8_ = 0x42c8000043480000;
        ImGui::SetNextWindowSize((ImVec2 *)&projection,4);
        ImGui::Begin("Another Window",&show_another_window,0);
        ImGui::Text("Options:");
        ImGui::InputInt("Rotate Index",&s1,1,100,0);
        ImGui::End();
      }
      (*gl3wClearColor)(0.2,0.3,0.3,1.0);
      (*gl3wClear)(0x4100);
      (*gl3wActiveTexture)(0x84c0);
      (*gl3wBindTexture)(0xde1,texture1);
      (*gl3wActiveTexture)(0x84c1);
      (*gl3wBindTexture)(0xde1,texture2);
      (*gl3wUseProgram)(shader.pID);
      fVar12 = tanf(fov * 0.017453292 * 0.5);
      projection.value[0].field_0._8_8_ = 0;
      projection.value[1].field_0._8_8_ = 0;
      projection.value[2].field_0._0_8_ = 0;
      projection.value[3].field_0._0_8_ = 0;
      projection.value[0].field_0.field_0.y = 0.0;
      projection.value[0].field_0.field_0.x = 1.0 / (fVar12 * 1.3333334);
      projection.value[1].field_0._0_8_ = (ulong)(uint)(1.0 / fVar12) << 0x20;
      projection.value[2].field_0._8_8_ = 0xbf800000bf80419a;
      projection.value[3].field_0._8_8_ = 0xbe4d0148;
      fVar12 = (cameraFront.field_0.field_0.x + cameraPos.field_0.field_0.x) -
               cameraPos.field_0.field_0.x;
      fVar26 = (cameraFront.field_0.field_0.y + cameraPos.field_0.field_0.y) -
               cameraPos.field_0.field_0.y;
      fVar30 = (cameraFront.field_0.field_0.z + cameraPos.field_0.field_0.z) -
               cameraPos.field_0.field_0.z;
      fVar13 = fVar30 * fVar30 + fVar26 * fVar26 + fVar12 * fVar12;
      if (fVar13 < 0.0) {
        local_8b8 = ZEXT416((uint)fVar12);
        _a = ZEXT416((uint)fVar26);
        local_898 = ZEXT416((uint)fVar30);
        fVar13 = sqrtf(fVar13);
        fVar12 = (float)local_8b8._0_4_;
        uVar23 = local_8b8._4_4_;
        uVar24 = local_8b8._8_4_;
        uVar25 = local_8b8._12_4_;
        fVar26 = a;
        uVar27 = uStack_8c4;
        uVar28 = uStack_8c0;
        uVar29 = uStack_8bc;
        fVar30 = (float)local_898._0_4_;
        uVar32 = local_898._4_4_;
        uVar33 = local_898._8_4_;
        uVar34 = local_898._12_4_;
      }
      else {
        fVar13 = SQRT(fVar13);
        uVar23 = 0;
        uVar24 = 0;
        uVar25 = 0;
        uVar27 = 0;
        uVar28 = 0;
        uVar29 = 0;
        uVar32 = 0;
        uVar33 = 0;
        uVar34 = 0;
      }
      fVar13 = 1.0 / fVar13;
      fVar12 = fVar12 * fVar13;
      fVar26 = fVar26 * fVar13;
      fVar30 = fVar30 * fVar13;
      fVar35 = fVar26 * cameraUp.field_0.field_0.z - fVar30 * cameraUp.field_0.field_0.y;
      fVar38 = fVar30 * cameraUp.field_0.field_0.x - cameraUp.field_0.field_0.z * fVar12;
      fVar13 = cameraUp.field_0.field_0.y * fVar12 - cameraUp.field_0.field_0.x * fVar26;
      fVar14 = fVar13 * fVar13 + fVar38 * fVar38 + fVar35 * fVar35;
      if (fVar14 < 0.0) {
        local_8b8._4_4_ = uVar23;
        local_8b8._0_4_ = fVar12;
        local_8b8._8_4_ = uVar24;
        local_8b8._12_4_ = uVar25;
        uStack_8c4 = uVar27;
        a = fVar26;
        uStack_8c0 = uVar28;
        uStack_8bc = uVar29;
        local_898._4_4_ = uVar32;
        local_898._0_4_ = fVar30;
        local_898._8_4_ = uVar33;
        local_898._12_4_ = uVar34;
        local_928 = fVar13;
        fVar14 = sqrtf(fVar14);
        fVar13 = local_928;
        fVar12 = (float)local_8b8._0_4_;
        fVar26 = a;
        fVar30 = (float)local_898._0_4_;
      }
      else {
        fVar14 = SQRT(fVar14);
      }
      fVar14 = 1.0 / fVar14;
      view.value[0].field_0.field_0.x = fVar35 * fVar14;
      view.value[1].field_0.field_0.x = fVar38 * fVar14;
      view.value[2].field_0.field_0.x = fVar14 * fVar13;
      view.value[0].field_0.field_0.y =
           view.value[1].field_0.field_0.x * fVar30 - view.value[2].field_0.field_0.x * fVar26;
      view.value[2].field_0.field_0.z = -fVar30;
      view.value[1].field_0.field_0.y =
           view.value[2].field_0.field_0.x * fVar12 - view.value[0].field_0.field_0.x * fVar30;
      view.value[0].field_0.field_0.z = -fVar12;
      view.value[2].field_0.field_0.y =
           view.value[0].field_0.field_0.x * fVar26 - view.value[1].field_0.field_0.x * fVar12;
      view.value[0].field_0.field_0.w = 0.0;
      view.value[2].field_0.field_0.w = 0.0;
      view.value[3].field_0.field_0.w = 1.0;
      view.value[1].field_0._8_8_ = (ulong)(uint)fVar26 ^ 0x80000000;
      view.value[3].field_0.field_0.x =
           -(view.value[2].field_0.field_0.x * cameraPos.field_0.field_0.z +
            view.value[1].field_0.field_0.x * cameraPos.field_0.field_0.y +
            view.value[0].field_0.field_0.x * cameraPos.field_0.field_0.x);
      view.value[3].field_0.field_0.y =
           -(view.value[2].field_0.field_0.y * cameraPos.field_0.field_0.z +
            view.value[1].field_0.field_0.y * cameraPos.field_0.field_0.y +
            view.value[0].field_0.field_0.y * cameraPos.field_0.field_0.x);
      view.value[3].field_0.field_0.z =
           fVar30 * cameraPos.field_0.field_0.z +
           fVar26 * cameraPos.field_0.field_0.y + fVar12 * cameraPos.field_0.field_0.x;
      local_918 = &local_908;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"projection","");
      p_Var4 = gl3wUniformMatrix4fv;
      GVar6 = (*gl3wGetUniformLocation)(shader.pID,(GLchar *)local_918);
      (*p_Var4)(GVar6,1,'\0',(GLfloat *)&projection);
      if (local_918 != &local_908) {
        operator_delete(local_918,CONCAT44(fStack_904,local_908) + 1);
      }
      local_918 = &local_908;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"view","");
      p_Var4 = gl3wUniformMatrix4fv;
      GVar6 = (*gl3wGetUniformLocation)(shader.pID,(GLchar *)local_918);
      (*p_Var4)(GVar6,1,'\0',(GLfloat *)&view);
      if (local_918 != &local_908) {
        operator_delete(local_918,CONCAT44(fStack_904,local_908) + 1);
      }
      (*gl3wBindVertexArray)(VAO);
      pfVar11 = (float *)&DAT_00160818;
      uVar10 = 0;
      do {
        local_918._0_4_ = 1.0;
        local_918._4_4_ = 0.0;
        fStack_910 = 0.0;
        fStack_90c = 0.0;
        local_908 = 0.0;
        fStack_904 = 1.0;
        uStack_900 = 0;
        local_8f8 = 0;
        fStack_8f0 = 1.0;
        fStack_8ec = 0.0;
        fVar12 = pfVar11[-2];
        fVar26 = pfVar11[-1];
        fVar30 = *pfVar11;
        local_8e8 = fVar30 * 0.0 + fVar26 * 0.0 + fVar12 + 0.0;
        fStack_8e4 = fVar30 * 0.0 + fVar12 * 0.0 + fVar26 + 0.0;
        fStack_8e0 = fVar26 * 0.0 + fVar12 * 0.0 + fVar30 + 0.0;
        fStack_8dc = fVar30 * 0.0 + fVar26 * 0.0 + fVar12 * 0.0 + 1.0;
        fVar12 = (float)(int)uVar10 * 20.0;
        if (uVar10 == (uint)s1) {
          dVar2 = (double)glfwGetTime();
          fVar12 = (float)(dVar2 * 25.0);
        }
        a = fVar12 * 0.017453292;
        fVar12 = cosf(fVar12 * 0.017453292);
        local_8b8._0_4_ = fVar12;
        fVar12 = sinf(a);
        fVar13 = 1.0 - (float)local_8b8._0_4_;
        fVar30 = fVar13 * 0.8638684;
        fVar26 = fVar13 * 0.25916055;
        fVar13 = fVar13 * 0.4319342;
        fVar36 = fVar30 * 0.8638684 + (float)local_8b8._0_4_;
        fVar38 = fVar30 * 0.25916055 + fVar12 * 0.4319342;
        fVar20 = fVar30 * 0.4319342 + fVar12 * -0.25916055;
        fVar31 = fVar26 * 0.8638684 + fVar12 * -0.4319342;
        fVar21 = fVar26 * 0.25916055 + (float)local_8b8._0_4_;
        fVar17 = fVar26 * 0.4319342 + fVar12 * 0.8638684;
        fVar22 = fVar13 * 0.8638684 + fVar12 * 0.25916055;
        fVar18 = fVar13 * 0.25916055 + fVar12 * -0.8638684;
        fVar39 = fVar13 * 0.4319342 + (float)local_8b8._0_4_;
        local_8b8._0_4_ = (float)local_918;
        local_898._0_4_ = fStack_904;
        local_928 = fStack_910;
        fVar14 = fVar38 * (float)uStack_900;
        local_8a0 = fStack_90c;
        a = uStack_900._4_4_;
        fVar15 = fVar38 * uStack_900._4_4_;
        fVar37 = fVar20 * (float)local_8f8;
        fVar12 = fVar20 * local_8f8._4_4_;
        fVar19 = fVar20 * fStack_8f0;
        local_8a4 = fStack_8ec;
        fVar20 = fVar20 * fStack_8ec;
        fVar26 = (float)local_918 * fVar31;
        fVar30 = fVar31 * local_918._4_4_;
        fVar13 = fVar17 * (float)local_8f8;
        fVar35 = fVar17 * local_8f8._4_4_;
        fVar16 = fVar17 * fStack_8f0;
        fVar17 = fVar17 * fStack_8ec;
        fStack_8f0 = fStack_8f0 * fVar39 + (float)uStack_900 * fVar18 + fStack_910 * fVar22;
        fStack_8ec = fVar39 * fStack_8ec + fVar18 * uStack_900._4_4_ + fVar22 * fStack_90c;
        uStack_900 = CONCAT44(fVar17 + fVar21 * uStack_900._4_4_ + fVar31 * fStack_90c,
                              fVar16 + fVar21 * (float)uStack_900 + fVar31 * fStack_910);
        local_8f8 = CONCAT44(local_8f8._4_4_ * fVar39 +
                             fStack_904 * fVar18 + local_918._4_4_ * fVar22,
                             (float)local_8f8 * fVar39 +
                             local_908 * fVar18 + (float)local_918 * fVar22);
        local_918._0_4_ = fVar37 + fVar38 * local_908 + fVar36 * (float)local_918;
        local_918._4_4_ = fVar12 + fVar38 * fStack_904 + fVar36 * local_918._4_4_;
        fStack_910 = fVar19 + fVar14 + fVar36 * fStack_910;
        fStack_90c = fVar20 + fVar15 + fVar36 * fStack_90c;
        local_908 = fVar13 + fVar21 * local_908 + fVar26;
        fStack_904 = fVar35 + fVar21 * fStack_904 + fVar30;
        local_7e0[0] = local_7d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"model","");
        p_Var4 = gl3wUniformMatrix4fv;
        GVar6 = (*gl3wGetUniformLocation)(shader.pID,(GLchar *)local_7e0[0]);
        (*p_Var4)(GVar6,1,'\0',(GLfloat *)&local_918);
        if (local_7e0[0] != local_7d0) {
          operator_delete(local_7e0[0],local_7d0[0] + 1);
        }
        (*gl3wDrawArrays)(4,0,0x24);
        uVar10 = uVar10 + 1;
        pfVar11 = pfVar11 + 3;
      } while (uVar10 != 10);
      ImGui::Render();
      glfwSwapBuffers(window);
      glfwPollEvents();
    }
    ImGui_ImplGlfwGL3_Shutdown();
    (*gl3wDeleteVertexArrays)(1,&VAO);
    (*gl3wDeleteBuffers)(1,&VBO);
    glfwTerminate();
    Shader::~Shader(&shader);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int main(int, char**)
{
    // Setup window
    char path[1024];
    bool show_another_window = true;

    GLuint ID;
    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
      return 1;

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
#if __APPLE__
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
#endif
    GLFWwindow* window = glfwCreateWindow(SCR_WIDTH, SCR_HEIGHT, "ImGui GLFW example 09", NULL, NULL);
    glfwMakeContextCurrent(window);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetCursorPosCallback(window, mouse_callback);
    glfwSetScrollCallback(window, scroll_callback);

    // tell GLFW to capture our mouse
    glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);

    gl3wInit();
    glEnable(GL_DEPTH_TEST);

    int nrAttributes;
    glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &nrAttributes);
    std::cout << "Maximum nr of vertex attributes supported: " << nrAttributes << std::endl;

    // Setup ImGui binding
    ImGui_ImplGlfwGL3_Init(window, true);

    ImVec4 clear_color = ImColor(114, 144, 154);

    // ------------------------------------
    // vertex shader
    getcwd((char*)path,1023);
    Shader shader;
    shader.loadVS(path);
    shader.loadFS(path);
    shader.build();

    // set up vertex data (and buffer(s)) and configure vertex attributes
    // ------------------------------------------------------------------
    float vertices[] = {
        -0.5f, -0.5f, -0.5f,  0.0f, 0.0f,
         0.5f, -0.5f, -0.5f,  1.0f, 0.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
        -0.5f,  0.5f, -0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 0.0f,

        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
         0.5f, -0.5f,  0.5f,  1.0f, 0.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 1.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 1.0f,
        -0.5f,  0.5f,  0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,

        -0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
        -0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
        -0.5f,  0.5f,  0.5f,  1.0f, 0.0f,

         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
         0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
         0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
         0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,

        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,
         0.5f, -0.5f, -0.5f,  1.0f, 1.0f,
         0.5f, -0.5f,  0.5f,  1.0f, 0.0f,
         0.5f, -0.5f,  0.5f,  1.0f, 0.0f,
        -0.5f, -0.5f,  0.5f,  0.0f, 0.0f,
        -0.5f, -0.5f, -0.5f,  0.0f, 1.0f,

        -0.5f,  0.5f, -0.5f,  0.0f, 1.0f,
         0.5f,  0.5f, -0.5f,  1.0f, 1.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
         0.5f,  0.5f,  0.5f,  1.0f, 0.0f,
        -0.5f,  0.5f,  0.5f,  0.0f, 0.0f,
        -0.5f,  0.5f, -0.5f,  0.0f, 1.0f
    };
    // world space positions of our cubes
    glm::vec3 cubePositions[] = {
        glm::vec3( 0.0f,  0.0f,  0.0f),
        glm::vec3( 2.0f,  5.0f, -15.0f),
        glm::vec3(-1.5f, -2.2f, -2.5f),
        glm::vec3(-3.8f, -2.0f, -12.3f),
        glm::vec3( 2.4f, -0.4f, -3.5f),
        glm::vec3(-1.7f,  3.0f, -7.5f),
        glm::vec3( 1.3f, -2.0f, -2.5f),
        glm::vec3( 1.5f,  2.0f, -2.5f),
        glm::vec3( 1.5f,  0.2f, -1.5f),
        glm::vec3(-1.3f,  1.0f, -1.5f)
    };
    unsigned int VBO, VAO;
    glGenVertexArrays(1, &VAO);
    glGenBuffers(1, &VBO);

    glBindVertexArray(VAO);

    glBindBuffer(GL_ARRAY_BUFFER, VBO);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    // position attribute
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 5 * sizeof(float), (void*)0);
    glEnableVertexAttribArray(0);
    // texture coord attribute
    glVertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 5 * sizeof(float), (void*)(3 * sizeof(float)));
    glEnableVertexAttribArray(1);


    // load and create a texture
    // -------------------------
    unsigned int texture1, texture2;
    // texture 1
    // ---------
    glGenTextures(1, &texture1);
    glBindTexture(GL_TEXTURE_2D, texture1);
    // set the texture wrapping parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    // set texture filtering parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    // load image, create texture and generate mipmaps
    int width, height, nrChannels;
    stbi_set_flip_vertically_on_load(true); // tell stb_image.h to flip loaded texture's on the y-axis.


    getcwd((char*)path,1023);
    strcat((char*)path,"/container.jpg");
    printf("path[%s]\n",(char*)path);
    unsigned char *data = stbi_load((char*)path, &width, &height, &nrChannels, 0);
    if (data){
      glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, GL_RGB, GL_UNSIGNED_BYTE, data);
      glGenerateMipmap(GL_TEXTURE_2D);
    }
    else{
        std::cout << "Failed to load texture" << std::endl;
    }
    stbi_image_free(data);
    // texture 2
    // ---------
    glGenTextures(1, &texture2);
    glBindTexture(GL_TEXTURE_2D, texture2);
    // set the texture wrapping parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    // set texture filtering parameters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    // load image, create texture and generate mipmaps
    getcwd((char*)path,1023);
    strcat((char*)path,"/awesomeface.png");
    printf("path[%s]\n",(char*)path);
    data = stbi_load((char*)path, &width, &height, &nrChannels, 0);
    if (data){
        // note that the awesomeface.png has transparency and thus an alpha channel, so make sure to tell OpenGL the data type is of GL_RGBA
        glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, data);
        glGenerateMipmap(GL_TEXTURE_2D);
    }
    else{
        std::cout << "Failed to load texture" << std::endl;
    }
    stbi_image_free(data);

    shader.use();
    shader.setInt("texture1", 0);
    shader.setInt("texture2", 1);
    //// END VERTEX
    while (!glfwWindowShouldClose(window)){

        float currentFrame = glfwGetTime();
        deltaTime = currentFrame - lastFrame;
        lastFrame = currentFrame;
        processInput(window);

        ImGui_ImplGlfwGL3_NewFrame();
        // 1. Show a simple window
        if (show_another_window){
            ImGui::SetNextWindowSize(ImVec2(200,100), ImGuiSetCond_FirstUseEver);
            ImGui::Begin("Another Window", &show_another_window);
            ShowAnotherWindow();
            ImGui::End();
        }
        // render
        // ------
        glClearColor(0.2f, 0.3f, 0.3f, 1.0f);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT); // also clear the depth buffer now!

         // bind textures on corresponding texture units
        glActiveTexture(GL_TEXTURE0);
        glBindTexture(GL_TEXTURE_2D, texture1);
        glActiveTexture(GL_TEXTURE1);
        glBindTexture(GL_TEXTURE_2D, texture2);

        // activate shader
        shader.use();

        // create transformations
        glm::mat4 projection = glm::perspective(glm::radians(fov), (float)SCR_WIDTH / (float)SCR_HEIGHT, 0.1f, 100.0f);
        glm::mat4 view = glm::lookAt(cameraPos, cameraPos + cameraFront, cameraUp);
        shader.setMat4("projection", projection);
        shader.setMat4("view", view);

        // render boxes
        glBindVertexArray(VAO);
        for (unsigned int i = 0; i < 10; i++)
        {
            // calculate the model matrix for each object and pass it to shader before drawing
            glm::mat4 model;
            model = glm::translate(model, cubePositions[i]);
            float angle = 20.0f * i;
            //model = glm::rotate(model, glm::radians(angle), glm::vec3(1.0f, 0.3f, 0.5f));
            //model = glm::rotate(model, (float)glfwGetTime() * glm::radians(50.0f), glm::vec3(0.5f, 1.0f, 0.0f));
            //glUniformMatrix4fv(glGetUniformLocation(shader.getpID(), "model"), 1, GL_FALSE, &model[0][0]);
            if(s1!=-1){  // every 3rd iteration (including the first) we set the angle using GLFW's time function.
              if(i==s1)
                angle = glfwGetTime() * 25.0f;
            }
            model = glm::rotate(model, glm::radians(angle), glm::vec3(1.0f, 0.3f, 0.5f));
            shader.setMat4("model", model);
            glDrawArrays(GL_TRIANGLES, 0, 36);
        }

        ImGui::Render();
        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    // Cleanup
    ImGui_ImplGlfwGL3_Shutdown();

    glDeleteVertexArrays(1, &VAO);
    glDeleteBuffers(1, &VBO);

    glfwTerminate();
    return 0;
}